

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mergesort_lcp.cpp
# Opt level: O3

void merge_cache_lcp_2way<true,unsigned_char>
               (uchar **from0,lcp_t *lcp_input0,uchar *cache_input0,size_t n0,uchar **from1,
               lcp_t *lcp_input1,uchar *cache_input1,size_t n1,uchar **result,lcp_t *lcp_result,
               uchar *cache_result)

{
  ulong uVar1;
  int iVar2;
  ulong uVar3;
  uchar **__dest;
  byte cache0;
  lcp_t lcp0;
  ptrdiff_t _Num;
  uchar *puVar4;
  byte *pbVar5;
  byte cache1;
  lcp_t *local_a0;
  byte *local_98;
  ulong *local_78;
  byte *local_70;
  size_t local_68;
  size_t local_50;
  ulong local_40;
  int local_38;
  
  check_input<unsigned_char>(from0,lcp_input0,cache_input0,n0);
  local_50 = n1;
  check_input<unsigned_char>(from1,lcp_input1,cache_input1,n1);
  local_98 = cache_input0 + 1;
  cache0 = *cache_input0;
  local_70 = cache_input1 + 1;
  cache1 = *cache_input1;
  local_78 = lcp_input1;
  if (cache0 < cache1) {
    puVar4 = *from0;
    if (puVar4 == (uchar *)0x0) {
LAB_001d66fa:
      __assert_fail("a != 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                    ,0x51,"int cmp(const unsigned char *, const unsigned char *)");
    }
    if (*from1 == (uchar *)0x0) {
LAB_001d6719:
      __assert_fail("b != 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                    ,0x52,"int cmp(const unsigned char *, const unsigned char *)");
    }
    iVar2 = strcmp((char *)puVar4,(char *)*from1);
    if (-1 < iVar2) {
      __assert_fail("cmp(*from0, *from1) < 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                    ,0x449,
                    "void merge_cache_lcp_2way(unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict) [OutputLCP = true, CharT = unsigned char]"
                   );
    }
    *result = puVar4;
    __dest = result + 1;
    *cache_result = cache0;
    pbVar5 = cache_result + 1;
    local_68 = n0 - 1;
    if (local_68 == 0) {
      local_40 = 0;
      goto LAB_001d607f;
    }
    from0 = from0 + 1;
    local_a0 = lcp_input0 + 1;
    cache0 = cache_input0[1];
    local_98 = cache_input0 + 2;
    uVar3 = 0;
    lcp0 = *lcp_input0;
    uVar1 = local_40;
LAB_001d6214:
    do {
      while( true ) {
        local_40 = uVar1;
        check_lcp_and_cache<unsigned_char>(__dest[-1],*from0,lcp0,cache0,*from1,uVar3,cache1);
        if (uVar3 < lcp0) {
          puVar4 = *from0;
          if (puVar4 != (uchar *)0x0) {
            if (*from1 != (uchar *)0x0) {
              iVar2 = strcmp((char *)puVar4,(char *)*from1);
              if (-1 < iVar2) {
                __assert_fail("cmp(*from0, *from1) < 0",
                              "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                              ,0x4ae,
                              "void merge_cache_lcp_2way(unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict) [OutputLCP = true, CharT = unsigned char]"
                             );
              }
              *__dest = puVar4;
              *lcp_result = lcp0;
              *pbVar5 = cache0;
              lcp0 = *local_a0;
              cache0 = *local_98;
              uVar1 = local_40;
              goto joined_r0x001d6624;
            }
            goto LAB_001d6719;
          }
          goto LAB_001d66fa;
        }
        if (lcp0 < uVar3) break;
        if (cache0 < cache1) {
          puVar4 = *from0;
          if (puVar4 != (uchar *)0x0) {
            if (*from1 != (uchar *)0x0) {
              iVar2 = strcmp((char *)puVar4,(char *)*from1);
              if (-1 < iVar2) {
                __assert_fail("cmp(*from0, *from1) < 0",
                              "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                              ,0x4c6,
                              "void merge_cache_lcp_2way(unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict) [OutputLCP = true, CharT = unsigned char]"
                             );
              }
              *__dest = puVar4;
              *lcp_result = lcp0;
              *pbVar5 = cache0;
LAB_001d6423:
              lcp0 = *local_a0;
              cache0 = *local_98;
              uVar1 = local_40;
              goto joined_r0x001d6624;
            }
            goto LAB_001d6719;
          }
          goto LAB_001d66fa;
        }
        if (cache1 < cache0) {
          if (*from0 != (uchar *)0x0) {
            puVar4 = *from1;
            if (puVar4 != (uchar *)0x0) {
              iVar2 = strcmp((char *)*from0,(char *)puVar4);
              if (iVar2 < 1) {
                __assert_fail("cmp(*from0, *from1) > 0",
                              "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                              ,0x4d6,
                              "void merge_cache_lcp_2way(unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict) [OutputLCP = true, CharT = unsigned char]"
                             );
              }
              goto LAB_001d6340;
            }
            goto LAB_001d6719;
          }
          goto LAB_001d66fa;
        }
        if (cache0 == 0) {
          puVar4 = *from0;
          if (puVar4 != (uchar *)0x0) {
            if (*from1 != (uchar *)0x0) {
              iVar2 = strcmp((char *)puVar4,(char *)*from1);
              if (iVar2 != 0) {
                __assert_fail("cmp(*from0, *from1) == 0",
                              "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                              ,0x4e7,
                              "void merge_cache_lcp_2way(unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict) [OutputLCP = true, CharT = unsigned char]"
                             );
              }
              *__dest = puVar4;
              *lcp_result = lcp0;
              *pbVar5 = 0;
              goto LAB_001d6423;
            }
            goto LAB_001d6719;
          }
          goto LAB_001d66fa;
        }
        compare((uchar *)&local_40,*from0,(size_t)*from1);
        uVar1 = local_40;
        if (local_38 < 0) {
          *__dest = *from0;
          *lcp_result = lcp0;
          *pbVar5 = cache0;
          if (*from1 == (uchar *)0x0) goto LAB_001d67b4;
          cache0 = *local_98;
          lcp0 = *local_a0;
          cache1 = (*from1)[local_40];
          uVar3 = local_40;
        }
        else {
          if (local_38 != 0) {
            *__dest = *from1;
            *lcp_result = lcp0;
            *pbVar5 = cache0;
            if (*from0 != (uchar *)0x0) {
              cache0 = (*from0)[local_40];
              uVar3 = *local_78;
              cache1 = *local_70;
              lcp0 = local_40;
              goto joined_r0x001d6398;
            }
            goto LAB_001d67b4;
          }
          *__dest = *from0;
          *lcp_result = lcp0;
          *pbVar5 = cache0;
          lcp0 = *local_a0;
          cache0 = *local_98;
          cache1 = 0;
          uVar3 = local_40;
        }
joined_r0x001d6624:
        local_40 = uVar3;
        local_68 = local_68 - 1;
        from0 = from0 + 1;
        __dest = __dest + 1;
        lcp_result = lcp_result + 1;
        pbVar5 = pbVar5 + 1;
        local_a0 = local_a0 + 1;
        local_98 = local_98 + 1;
        uVar3 = local_40;
        if (local_68 == 0) goto LAB_001d607f;
      }
      if (*from0 == (uchar *)0x0) goto LAB_001d66fa;
      puVar4 = *from1;
      if (puVar4 == (uchar *)0x0) goto LAB_001d6719;
      iVar2 = strcmp((char *)*from0,(char *)puVar4);
      if (iVar2 < 1) {
        __assert_fail("cmp(*from0, *from1) > 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                      ,0x4b7,
                      "void merge_cache_lcp_2way(unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict) [OutputLCP = true, CharT = unsigned char]"
                     );
      }
LAB_001d6340:
      *__dest = puVar4;
      *lcp_result = uVar3;
      *pbVar5 = cache1;
      uVar3 = *local_78;
      cache1 = *local_70;
joined_r0x001d6398:
      local_50 = local_50 - 1;
      local_70 = local_70 + 1;
      local_78 = local_78 + 1;
      pbVar5 = pbVar5 + 1;
      lcp_result = lcp_result + 1;
      __dest = __dest + 1;
      from1 = from1 + 1;
      uVar1 = local_40;
    } while (local_50 != 0);
  }
  else {
    local_a0 = lcp_input0;
    local_68 = n0;
    if (cache0 <= cache1) {
      if (cache0 == 0) {
        puVar4 = *from0;
        if (puVar4 == (uchar *)0x0) goto LAB_001d66fa;
        if (*from1 == (uchar *)0x0) goto LAB_001d6719;
        iVar2 = strcmp((char *)puVar4,(char *)*from1);
        if (iVar2 != 0) {
          __assert_fail("cmp(*from0, *from1) == 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                        ,0x470,
                        "void merge_cache_lcp_2way(unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict) [OutputLCP = true, CharT = unsigned char]"
                       );
        }
        *result = puVar4;
        __dest = result + 1;
        *cache_result = '\0';
        pbVar5 = cache_result + 1;
        cache1 = 0;
        local_68 = n0 - 1;
        if (local_68 == 0) {
          local_40 = 0;
          goto LAB_001d607f;
        }
        from0 = from0 + 1;
        lcp0 = *lcp_input0;
        local_a0 = lcp_input0 + 1;
        cache0 = cache_input0[1];
        local_98 = cache_input0 + 2;
        uVar3 = 0;
        uVar1 = local_40;
      }
      else {
        compare((uchar *)&local_40,*from0,(size_t)*from1);
        uVar3 = local_40;
        uVar1 = local_40;
        if (local_38 < 0) {
          *result = *from0;
          *cache_result = cache0;
          if (*from1 == (uchar *)0x0) {
LAB_001d67b4:
            __assert_fail("ptr",
                          "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/util/get_char.h"
                          ,0x26,"unsigned char get_char(unsigned char *, size_t)");
          }
          pbVar5 = cache_result + 1;
          __dest = result + 1;
          cache1 = (*from1)[local_40];
          local_68 = n0 - 1;
          if (local_68 == 0) goto LAB_001d607f;
          cache0 = cache_input0[1];
          local_98 = cache_input0 + 2;
          lcp0 = *lcp_input0;
          local_a0 = lcp_input0 + 1;
          from0 = from0 + 1;
        }
        else if (local_38 == 0) {
          *result = *from0;
          __dest = result + 1;
          *cache_result = cache0;
          pbVar5 = cache_result + 1;
          cache1 = 0;
          local_68 = n0 - 1;
          if (local_68 == 0) {
LAB_001d607f:
            if (local_50 == 0) {
              __assert_fail("n1",
                            "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                            ,0x51e,
                            "void merge_cache_lcp_2way(unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict) [OutputLCP = true, CharT = unsigned char]"
                           );
            }
            *lcp_result = local_40;
            *pbVar5 = cache1;
            memmove(__dest,from1,local_50 * 8);
            memmove(lcp_result + 1,local_78,local_50 * 8);
            goto LAB_001d66d9;
          }
          from0 = from0 + 1;
          lcp0 = *lcp_input0;
          local_a0 = lcp_input0 + 1;
          cache0 = cache_input0[1];
          local_98 = cache_input0 + 2;
        }
        else {
          *result = *from1;
          *cache_result = cache1;
          if (*from0 == (uchar *)0x0) goto LAB_001d67b4;
          pbVar5 = cache_result + 1;
          __dest = result + 1;
          cache0 = (*from0)[local_40];
          local_50 = n1 - 1;
          lcp0 = local_40;
          if (local_50 == 0) goto LAB_001d6690;
          local_78 = lcp_input1 + 1;
          from1 = from1 + 1;
          cache1 = cache_input1[1];
          local_70 = cache_input1 + 2;
          uVar3 = *lcp_input1;
        }
      }
      goto LAB_001d6214;
    }
    if (*from0 == (uchar *)0x0) goto LAB_001d66fa;
    puVar4 = *from1;
    if (puVar4 == (uchar *)0x0) goto LAB_001d6719;
    iVar2 = strcmp((char *)*from0,(char *)puVar4);
    if (iVar2 < 1) {
      __assert_fail("cmp(*from0, *from1) > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                    ,0x45c,
                    "void merge_cache_lcp_2way(unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict) [OutputLCP = true, CharT = unsigned char]"
                   );
    }
    *result = puVar4;
    __dest = result + 1;
    *cache_result = cache1;
    pbVar5 = cache_result + 1;
    local_50 = n1 - 1;
    lcp0 = 0;
    if (local_50 != 0) {
      from1 = from1 + 1;
      local_78 = lcp_input1 + 1;
      cache1 = cache_input1[1];
      local_70 = cache_input1 + 2;
      uVar3 = *lcp_input1;
      lcp0 = 0;
      uVar1 = local_40;
      goto LAB_001d6214;
    }
  }
LAB_001d6690:
  if (local_68 == 0) {
    __assert_fail("n0",
                  "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                  ,0x527,
                  "void merge_cache_lcp_2way(unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict) [OutputLCP = true, CharT = unsigned char]"
                 );
  }
  *lcp_result = lcp0;
  *pbVar5 = cache0;
  memmove(__dest,from0,local_68 * 8);
  memmove(lcp_result + 1,local_a0,local_68 * 8);
  local_70 = local_98;
  local_50 = local_68;
LAB_001d66d9:
  memmove(pbVar5 + 1,local_70,local_50);
  return;
}

Assistant:

void
merge_cache_lcp_2way(
       unsigned char** from0,  lcp_t* restrict lcp_input0, CharT* restrict cache_input0, size_t n0,
       unsigned char** from1,  lcp_t* restrict lcp_input1, CharT* restrict cache_input1, size_t n1,
       unsigned char** result, lcp_t* restrict lcp_result, CharT* restrict cache_result)
{
	debug() << __func__ << "(): n0=" << n0 << ", n1=" << n1 << '\n';

	check_input(from0, lcp_input0, cache_input0, n0);
	check_input(from1, lcp_input1, cache_input1, n1);

	lcp_t lcp0=0, lcp1=0;
	CharT cache0 = *cache_input0++;
	CharT cache1 = *cache_input1++;
	{
		stat_try_cache();
		if (cache0 < cache1) {
			assert(cmp(*from0, *from1) < 0);
			if (sizeof(CharT) > 1) {
				const int l = lcp(cache0, cache1);
				if (l > 0) {
					cache1 = get_char<CharT>(*from1, l);
				}
				*result++ = *from0++;
				if (OutputLCP) *cache_result++ = cache0;
				lcp0 = *lcp_input0++;
				lcp1 = l;
				cache0 = *cache_input0++;
			} else {
				*result++ = *from0++;
				if (OutputLCP) *cache_result++ = cache0;
				lcp0 = *lcp_input0++;
				cache0 = *cache_input0++;
			}
			if (--n0 == 0) goto finish0;
		} else if (cache0 > cache1) {
			assert(cmp(*from0, *from1) > 0);
			if (sizeof(CharT) > 1) {
				const int l = lcp(cache0, cache1);
				if (l > 0) {
					cache0 = get_char<CharT>(*from0, l);
				}
				*result++ = *from1++;
				if (OutputLCP) *cache_result++ = cache1;
				lcp0 = l;
				lcp1 = *lcp_input1++;
				cache1 = *cache_input1++;
			} else {
				*result++ = *from1++;
				if (OutputLCP) *cache_result++ = cache1;
				lcp1 = *lcp_input1++;
				cache1 = *cache_input1++;
			}
			if (--n1 == 0) goto finish1;
		} else {
			if (is_end(cache0)) {
				assert(cmp(*from0, *from1) == 0);
				if (sizeof(CharT) > 1) {
					const int l = lcp(cache0, cache1);
					*result++ = *from0++;
					if (OutputLCP) *cache_result++ = cache0;
					lcp0 = *lcp_input0++;
					lcp1 = l;
					cache0 = *cache_input0++;
					cache1 = 0;
				} else {
					*result++ = *from0++;
					if (OutputLCP) *cache_result++ = cache0;
					lcp0 = *lcp_input0++;
					cache0 = *cache_input0++;
					cache1 = 0;
				}
				if (--n0 == 0) goto finish0;
			} else {
				stat_cache_useless();
				int cmp01; lcp_t lcp01;
				std::tie(cmp01, lcp01) = compare(*from0, *from1, sizeof(CharT));
				if (cmp01 < 0) {
					*result++ = *from0++;
					if (OutputLCP) *cache_result++ = cache0;
					lcp0 = *lcp_input0++;
					lcp1 = lcp01;
					cache0 = *cache_input0++;
					cache1 = get_char<CharT>(*from1, lcp01);
					if (--n0 == 0) goto finish0;
				} else if (cmp01 == 0) {
					*result++ = *from0++;
					if (OutputLCP) *cache_result++ = cache0;
					lcp0 = *lcp_input0++;
					lcp1 = lcp01;
					cache0 = *cache_input0++;
					cache1 = 0;
					if (--n0 == 0) goto finish0;
				} else {
					*result++ = *from1++;
					if (OutputLCP) *cache_result++ = cache1;
					lcp0 = lcp01;
					lcp1 = *lcp_input1++;
					cache0 = get_char<CharT>(*from0, lcp01);
					cache1 = *cache_input1++;
					if (--n1 == 0) goto finish1;
				}
			}
		}
	}
	while (true) {
		debug() << "Starting loop, n0="<<n0<<", n1="<<n1<<" ...\n"
			<< "\tprev   = '"<<*(result-1)<<"'\n"
			<< "\t*from0 = '"<<*from0<<"'\n"
			<< "\t*from1 = '"<<*from1<<"'\n"
			<< "\tlcp0   = " <<lcp0<<"\n"
			<< "\tlcp1   = " <<lcp1<<"\n"
			<< "\tcache0 = '"<<to_str(cache0)<<"'\n"
			<< "\tcache1 = '"<<to_str(cache1)<<"'\n"
			<< "\n";
		check_lcp_and_cache(*(result-1),*from0,lcp0,cache0,*from1,lcp1,cache1);
		if (lcp0 > lcp1) {
			debug() << "\tlcp0 > lcp1\n";
			assert(cmp(*from0, *from1) < 0);
			*result++ = *from0++;
			if (OutputLCP) *lcp_result++ = lcp0;
			if (OutputLCP) *cache_result++ = cache0;
			lcp0 = *lcp_input0++;
			cache0 = *cache_input0++;
			if (--n0 == 0) goto finish0;
		} else if (lcp0 < lcp1) {
			debug() << "\tlcp0 < lcp1\n";
			assert(cmp(*from0, *from1) > 0);
			*result++ = *from1++;
			if (OutputLCP) *lcp_result++ = lcp1;
			if (OutputLCP) *cache_result++ = cache1;
			lcp1 = *lcp_input1++;
			cache1 = *cache_input1++;
			if (--n1 == 0) goto finish1;
		} else {
			debug() << "\tlcp0 == lcp1\n";
			stat_try_cache();
			// Both strings in the sorted sequences have the same
			// prefix than the latest string in output. Check
			// cached characters first.
			if (cache0 < cache1) {
				debug() << "\t\tcache0 < cache1\n";
				assert(cmp(*from0, *from1) < 0);
				if (sizeof(CharT) > 1) {
					const int l = lcp(cache0, cache1);
					if (l > 0) {
						lcp1 += l;
						cache1 = get_char<CharT>(*from1, lcp1);
					}
				}
				*result++ = *from0++;
				if (OutputLCP) *lcp_result++ = lcp0;
				if (OutputLCP) *cache_result++ = cache0;
				lcp0 = *lcp_input0++;
				cache0 = *cache_input0++;
				if (--n0 == 0) goto finish0;
			} else if (cache0 > cache1) {
				debug() << "\t\tcache0 > cache1\n";
				assert(cmp(*from0, *from1) > 0);
				if (sizeof(CharT) > 1) {
					const int l = lcp(cache0, cache1);
					if (l > 0) {
						lcp0 += l;
						cache0 = get_char<CharT>(*from0, lcp0);
					}
				}
				*result++ = *from1++;
				if (OutputLCP) *lcp_result++ = lcp1;
				if (OutputLCP) *cache_result++ = cache1;
				lcp1 = *lcp_input1++;
				cache1 = *cache_input1++;
				if (--n1 == 0) goto finish1;
			} else {
				debug() << "\t\tcache0 == cache1\n";
				if (is_end(cache0)) {
					assert(cmp(*from0, *from1) == 0);
					if (sizeof(CharT) > 1) {
						*result++ = *from0++;
						if (OutputLCP) *lcp_result++ = lcp0 /* == lcp1 */;
						if (OutputLCP) *cache_result++ = cache0 /* == cache1 */;
						lcp0 = *lcp_input0++;
						lcp1 += lcp(cache0, cache1);
						cache0 = *cache_input0++;
						cache1 = 0;
					} else {
						*result++ = *from0++;
						if (OutputLCP) *lcp_result++ = lcp0 /* == lcp1 */;
						if (OutputLCP) *cache_result++ = cache0 /* == cache1 */;
						lcp0 = *lcp_input0++;
						cache0 = *cache_input0++;
					}
					if (--n0 == 0) goto finish0;
				} else {
					stat_cache_useless();
					int cmp01; lcp_t lcp01;
					std::tie(cmp01, lcp01) = compare(*from0, *from1, lcp0+sizeof(CharT));
					if (cmp01 < 0) {
						*result++ = *from0++;
						if (OutputLCP) *lcp_result++ = lcp0 /* == lcp1 */;
						if (OutputLCP) *cache_result++ = cache0 /* == cache1 */;
						lcp0 = *lcp_input0++;
						lcp1 = lcp01;
						cache0 = *cache_input0++;
						cache1 = get_char<CharT>(*from1, lcp01);
						if (--n0 == 0) goto finish0;
					} else if (cmp01 == 0) {
						*result++ = *from0++;
						if (OutputLCP) *lcp_result++ = lcp0 /* == lcp1 */;
						if (OutputLCP) *cache_result++ = cache0 /* == cache1 */;
						lcp0 = *lcp_input0++;
						lcp1 = lcp01;
						cache0 = *cache_input0++;
						cache1 = 0;
						if (--n0 == 0) goto finish0;
					} else {
						*result++ = *from1++;
						if (OutputLCP) *lcp_result++ = lcp0 /* == lcp1 */;
						if (OutputLCP) *cache_result++ = cache0 /* == cache1 */;
						lcp0 = lcp01;
						lcp1 = *lcp_input1++;
						cache0 = get_char<CharT>(*from0, lcp01);
						cache1 = *cache_input1++;
						if (--n1 == 0) goto finish1;
					}
				}
			}
		}
	}
finish0:
	assert(n0==0);
	assert(n1);
	if (OutputLCP) *lcp_result++ = lcp1;
	if (OutputLCP) *cache_result++ = cache1;
	std::copy(from1, from1+n1, result);
	if (OutputLCP) std::copy(lcp_input1, lcp_input1+n1, lcp_result);
	if (OutputLCP) std::copy(cache_input1, cache_input1+n1, cache_result);
	debug() << '~' << __func__ << '\n';
	return;
finish1:
	assert(n0);
	assert(n1==0);
	if (OutputLCP) *lcp_result++ = lcp0;
	if (OutputLCP) *cache_result++ = cache0;
	std::copy(from0, from0+n0, result);
	if (OutputLCP) std::copy(lcp_input0, lcp_input0+n0, lcp_result);
	if (OutputLCP) std::copy(cache_input0, cache_input0+n0, cache_result);
	debug() << '~' << __func__ << '\n';
	return;
}